

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::rebuildOrderHeap(Solver *this)

{
  byte bVar1;
  int iVar2;
  int local_3c;
  vec<int,_int> local_38;
  
  local_38.data = (int *)0x0;
  local_38.sz = 0;
  local_38.cap = 0;
  local_3c = 0;
  iVar2 = this->next_var;
  if (0 < iVar2) {
    do {
      if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= local_3c
         ) {
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x28,
                      "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
                     );
      }
      if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[local_3c]
          != '\0') {
        if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz
            <= local_3c) {
          __assert_fail("has(k)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                        ,0x27,
                        "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                       );
        }
        bVar1 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map
                .data[local_3c].value;
        if (bVar1 == l_Undef && (l_Undef & 2) == 0 || (l_Undef & 2 & bVar1) != 0) {
          vec<int,_int>::push(&local_38,&local_3c);
          iVar2 = this->next_var;
        }
      }
      local_3c = local_3c + 1;
    } while (local_3c < iVar2);
  }
  Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::build
            (&this->order_heap,&local_38);
  if (local_38.data != (int *)0x0) {
    local_38._8_8_ = local_38._8_8_ & 0xffffffff00000000;
    free(local_38.data);
  }
  return;
}

Assistant:

void Solver::rebuildOrderHeap()
{
    vec<Var> vs;
    for (Var v = 0; v < nVars(); v++)
        if (decision[v] && value(v) == l_Undef)
            vs.push(v);
    order_heap.build(vs);
}